

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQbf.c
# Opt level: O1

void Abc_NtkQbf(Abc_Ntk_t *pNtk,int nPars,int nItersMax,int fDumpCnf,int fVerbose)

{
  uint *puVar1;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p;
  void *__s;
  Vec_Int_t *pVVar7;
  int *piVar8;
  Vec_Int_t *vExists;
  char *pcVar9;
  time_t tVar10;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pAVar11;
  Abc_Ntk_t *pAVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  Vec_Int_t *p_00;
  long lVar17;
  timespec ts;
  
  iVar4 = clock_gettime(3,(timespec *)&ts);
  if (iVar4 < 0) {
    lVar13 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcQbf.c"
                  ,0x4a,"void Abc_NtkQbf(Abc_Ntk_t *, int, int, int, int)");
  }
  if (pNtk->nObjCounts[8] != 0) {
    __assert_fail("Abc_NtkIsComb(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcQbf.c"
                  ,0x4b,"void Abc_NtkQbf(Abc_Ntk_t *, int, int, int, int)");
  }
  if (pNtk->vPos->nSize != 1) {
    __assert_fail("Abc_NtkPoNum(pNtk) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcQbf.c"
                  ,0x4c,"void Abc_NtkQbf(Abc_Ntk_t *, int, int, int, int)");
  }
  if ((nPars < 1) || (iVar4 = pNtk->vPis->nSize, iVar4 <= nPars)) {
    __assert_fail("nPars > 0 && nPars < Abc_NtkPiNum(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcQbf.c"
                  ,0x4d,"void Abc_NtkQbf(Abc_Ntk_t *, int, int, int, int)");
  }
  if (fDumpCnf != 0) {
    __s = (void *)0x0;
    pAig = Abc_NtkToDar(pNtk,0,0);
    p = Cnf_Derive(pAig,0);
    iVar4 = p->nVars;
    iVar16 = 0x10;
    if (0xe < iVar4 - 1U) {
      iVar16 = iVar4;
    }
    if (iVar16 != 0) {
      __s = malloc((long)iVar16 << 2);
    }
    memset(__s,0,(long)iVar4 * 4);
    pVVar2 = pAig->vCis;
    if (0 < pVVar2->nSize) {
      uVar14 = 0;
      do {
        if (uVar14 < (uint)nPars) {
          iVar16 = p->pVarNums[*(int *)((long)pVVar2->pArray[uVar14] + 0x24)];
          if (((long)iVar16 < 0) || (iVar4 <= iVar16)) {
LAB_00290a8a:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(undefined4 *)((long)__s + (long)iVar16 * 4) = 1;
        }
        uVar14 = uVar14 + 1;
      } while ((long)uVar14 < (long)pVVar2->nSize);
    }
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    uVar14 = 0x10;
    if (0x10 < (uint)nPars) {
      uVar14 = (ulong)(uint)nPars;
    }
    pVVar7->nSize = 0;
    pVVar7->nCap = (int)uVar14;
    piVar8 = (int *)malloc(uVar14 << 2);
    pVVar7->pArray = piVar8;
    iVar16 = pNtk->vPis->nSize - nPars;
    vExists = (Vec_Int_t *)malloc(0x10);
    if (iVar16 - 1U < 0xf) {
      iVar16 = 0x10;
    }
    piVar8 = (int *)0x0;
    vExists->nSize = 0;
    vExists->nCap = iVar16;
    if (iVar16 != 0) {
      piVar8 = (int *)malloc((long)iVar16 << 2);
    }
    vExists->pArray = piVar8;
    if (0 < iVar4) {
      lVar13 = 0;
      do {
        p_00 = vExists;
        if (*(int *)((long)__s + lVar13 * 4) != 0) {
          p_00 = pVVar7;
        }
        Vec_IntPush(p_00,(int)lVar13);
        lVar13 = lVar13 + 1;
      } while (iVar4 != lVar13);
    }
    pcVar9 = Extra_FileNameGenericAppend(pNtk->pSpec,".qdimacs");
    Cnf_DataWriteIntoFile(p,pcVar9,0,pVVar7,vExists);
    Aig_ManStop(pAig);
    Cnf_DataFree(p);
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      pVVar7->pArray = (int *)0x0;
    }
    free(pVVar7);
    if (vExists->pArray != (int *)0x0) {
      free(vExists->pArray);
      vExists->pArray = (int *)0x0;
    }
    free(vExists);
    if (__s != (void *)0x0) {
      free(__s);
    }
    printf("The 2QBF formula was written into file \"%s\".\n",pcVar9);
    return;
  }
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar16 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar16 = iVar4;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar16;
  if (iVar16 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar16 << 2);
  }
  pVVar7->pArray = piVar8;
  pVVar7->nSize = iVar4;
  memset(piVar8,0,(long)iVar4 << 2);
  tVar10 = time((time_t *)0x0);
  srand((uint)tVar10);
  if (nPars < pNtk->vPis->nSize) {
    uVar14 = (ulong)(uint)nPars;
    do {
      uVar5 = rand();
      if (pVVar7->nSize <= (int)uVar14) goto LAB_00290a8a;
      pVVar7->pArray[uVar14] = uVar5 & 1;
      uVar14 = uVar14 + 1;
    } while ((int)uVar14 < pNtk->vPis->nSize);
  }
  Abc_NtkVectorClearPars(pVVar7,nPars);
  pNtk_00 = Abc_NtkMiterCofactor(pNtk,pVVar7);
  if (fVerbose != 0) {
    printf("Iter %2d : ",0);
    printf("AIG = %6d  ",(ulong)(uint)pNtk_00->nObjCounts[7]);
    Abc_NtkVectorPrintVars(pNtk,pVVar7,nPars);
    putchar(10);
  }
  uVar5 = 0;
  if (0 < nItersMax) {
    uVar5 = nItersMax;
  }
  uVar3 = 0;
LAB_002906d8:
  uVar6 = uVar3;
  if (uVar5 != uVar6) {
    iVar4 = clock_gettime(3,(timespec *)&ts);
    if (iVar4 < 0) {
      lVar15 = 1;
    }
    else {
      lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
      lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + ts.tv_sec * -1000000;
    }
    iVar4 = Abc_NtkDSat(pNtk_00,0,0,0,0,0,1,0,0,0);
    iVar16 = clock_gettime(3,(timespec *)&ts);
    if (iVar16 < 0) {
      lVar17 = -1;
    }
    else {
      lVar17 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    if (iVar4 == 0) {
      Abc_NtkModelToVector(pNtk_00,pVVar7);
LAB_002907b9:
      Abc_NtkVectorClearVars(pNtk,pVVar7,nPars);
      pAVar11 = Abc_NtkMiterCofactor(pNtk,pVVar7);
      if (pAVar11->vPos->nSize < 1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar1 = (uint *)((long)*pAVar11->vPos->pArray + 0x14);
      *puVar1 = *puVar1 ^ 0x400;
      clock_gettime(3,(timespec *)&ts);
      iVar4 = Abc_NtkMiterSat(pAVar11,0,0,0,(ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0);
      clock_gettime(3,(timespec *)&ts);
      if (iVar4 == 0) {
        Abc_NtkModelToVector(pAVar11,pVVar7);
      }
      Abc_NtkDelete(pAVar11);
      if (iVar4 == -1) {
        pcVar9 = "Verification timed out.";
        goto LAB_0029096a;
      }
      if (iVar4 != 1) goto code_r0x00290859;
      Abc_NtkDelete(pNtk_00);
      if ((long)pVVar7->nSize < 1) {
        uVar5 = 0;
      }
      else {
        lVar15 = 0;
        uVar5 = 0;
        do {
          uVar5 = uVar5 + (pVVar7->pArray[lVar15] == 0);
          lVar15 = lVar15 + 1;
        } while (pVVar7->nSize != lVar15);
      }
      printf("Parameters: ");
      Abc_NtkVectorPrintPars(pVVar7,nPars);
      printf("  Statistics: 0=%d 1=%d\n",(ulong)uVar5,(ulong)(pVVar7->nSize - uVar5));
      pcVar9 = "Solved after %d interations.  ";
      goto LAB_002909d4;
    }
    if (iVar4 == -1) {
      pcVar9 = "Synthesis timed out.";
LAB_0029096a:
      puts(pcVar9);
    }
    else if (iVar4 != 1) goto LAB_002907b9;
  }
  goto LAB_0029096f;
code_r0x00290859:
  Abc_NtkVectorClearPars(pVVar7,nPars);
  pAVar11 = Abc_NtkMiterCofactor(pNtk,pVVar7);
  pAVar12 = Abc_NtkMiterAnd(pNtk_00,pAVar11,0,0);
  Abc_NtkDelete(pAVar11);
  Abc_NtkDelete(pNtk_00);
  if (fVerbose != 0) {
    printf("Iter %2d : ",(ulong)(uVar6 + 1));
    printf("AIG = %6d  ",(ulong)(uint)pAVar12->nObjCounts[7]);
    Abc_NtkVectorPrintVars(pNtk,pVVar7,nPars);
    iVar4 = 0x88a47e;
    printf("  ");
    Abc_Print(iVar4,"%s =","Syn");
    Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar17 + lVar15) / 1000000.0);
  }
  pNtk_00 = pAVar12;
  uVar3 = uVar6 + 1;
  if (nItersMax == uVar6 + 1) {
LAB_0029096f:
    Abc_NtkDelete(pNtk_00);
    if (nItersMax == uVar6) {
      pcVar9 = "Unsolved after %d interations.  ";
LAB_002909d4:
      printf(pcVar9,(ulong)uVar6);
      iVar4 = (int)pcVar9;
    }
    else {
      iVar4 = 0x878264;
      printf("Implementation does not exist.  ");
    }
    Abc_Print(iVar4,"%s =","Total runtime");
    iVar16 = 3;
    iVar4 = clock_gettime(3,(timespec *)&ts);
    if (iVar4 < 0) {
      lVar15 = -1;
    }
    else {
      lVar15 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    Abc_Print(iVar16,"%9.2f sec\n",(double)(lVar15 + lVar13) / 1000000.0);
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      pVVar7->pArray = (int *)0x0;
    }
    free(pVVar7);
    return;
  }
  goto LAB_002906d8;
}

Assistant:

ABC_NAMESPACE_IMPL_START


/*
   Implementation of a simple QBF solver along the lines of
   A. Solar-Lezama, L. Tancau, R. Bodik, V. Saraswat, and S. Seshia, 
   "Combinatorial sketching for finite programs", 12th International 
   Conference on Architectural Support for Programming Languages and 
   Operating Systems (ASPLOS 2006), San Jose, CA, October 2006.
*/

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

// static void Abc_NtkModelToVector( Abc_Ntk_t * pNtk, Vec_Int_t * vPiValues );
// static void Abc_NtkVectorClearPars( Vec_Int_t * vPiValues, int nPars );
// static void Abc_NtkVectorClearVars( Abc_Ntk_t * pNtk, Vec_Int_t * vPiValues, int nPars );
// static void Abc_NtkVectorPrintPars( Vec_Int_t * vPiValues, int nPars );
// static void Abc_NtkVectorPrintVars( Abc_Ntk_t * pNtk, Vec_Int_t * vPiValues, int nPars );

// extern int Abc_NtkDSat( Abc_Ntk_t * pNtk, ABC_INT64_T nConfLimit, ABC_INT64_T nInsLimit, int nLearnedStart, int nLearnedDelta, int nLearnedPerce, int fAlignPol, int fAndOuts, int fNewSolver, int fVerbose );

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Solve the QBF problem EpAx[M(p,x)].]

  Description [Variables p go first, followed by variable x.
  The number of parameters is nPars. The miter is in pNtk.
  The miter expresses EQUALITY of the implementation and spec.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_NtkQbf( Abc_Ntk_t * pNtk, int nPars, int nItersMax, int fDumpCnf, int fVerbose )
{
    Abc_Ntk_t * pNtkVer, * pNtkSyn, * pNtkSyn2, * pNtkTemp;
    Vec_Int_t * vPiValues;
    abctime clkTotal = Abc_Clock(), clkS, clkV;
    int nIters, nInputs, RetValue, fFound = 0;

    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkIsComb(pNtk) );
    assert( Abc_NtkPoNum(pNtk) == 1 );
    assert( nPars > 0 && nPars < Abc_NtkPiNum(pNtk) );
//    assert( Abc_NtkPiNum(pNtk)-nPars < 32 );
    nInputs = Abc_NtkPiNum(pNtk) - nPars;

    if ( fDumpCnf )
    {
        // original problem: \exists p \forall x \exists y.  M(p,x,y)
        // negated problem:  \forall p \exists x \exists y. !M(p,x,y)
        extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
        Aig_Man_t * pMan = Abc_NtkToDar( pNtk, 0, 0 );
        Cnf_Dat_t * pCnf = Cnf_Derive( pMan, 0 );
        Vec_Int_t * vVarMap, * vForAlls, * vExists;
        Aig_Obj_t * pObj;
        char * pFileName;
        int i, Entry;
        // create var map
        vVarMap = Vec_IntStart( pCnf->nVars );
        Aig_ManForEachCi( pMan, pObj, i )
            if ( i < nPars )
                Vec_IntWriteEntry( vVarMap, pCnf->pVarNums[Aig_ObjId(pObj)], 1 );
        // create various maps
        vForAlls = Vec_IntAlloc( nPars );
        vExists = Vec_IntAlloc( Abc_NtkPiNum(pNtk) - nPars );
        Vec_IntForEachEntry( vVarMap, Entry, i )
            if ( Entry )
                Vec_IntPush( vForAlls, i );
            else
                Vec_IntPush( vExists, i );
        // generate CNF
        pFileName = Extra_FileNameGenericAppend( pNtk->pSpec, ".qdimacs" );
        Cnf_DataWriteIntoFile( pCnf, pFileName, 0, vForAlls, vExists );
        Aig_ManStop( pMan );
        Cnf_DataFree( pCnf );
        Vec_IntFree( vForAlls );
        Vec_IntFree( vExists );
        Vec_IntFree( vVarMap );
        printf( "The 2QBF formula was written into file \"%s\".\n", pFileName );
        return;
    }

    // initialize the synthesized network with 0000-combination
    vPiValues = Vec_IntStart( Abc_NtkPiNum(pNtk) );

    // create random init value
    {
    int i;
    srand( time(NULL) );
    for ( i = nPars; i < Abc_NtkPiNum(pNtk); i++ )
        Vec_IntWriteEntry( vPiValues, i, rand() & 1 );
    }

    Abc_NtkVectorClearPars( vPiValues, nPars );
    pNtkSyn = Abc_NtkMiterCofactor( pNtk, vPiValues );
    if ( fVerbose )
    {
        printf( "Iter %2d : ", 0 );
        printf( "AIG = %6d  ", Abc_NtkNodeNum(pNtkSyn) );
        Abc_NtkVectorPrintVars( pNtk, vPiValues, nPars );
        printf( "\n" );
    }

    // iteratively solve
    for ( nIters = 0; nIters < nItersMax; nIters++ )
    {
        // solve the synthesis instance
clkS = Abc_Clock();
//        RetValue = Abc_NtkMiterSat( pNtkSyn, 0, 0, 0, NULL, NULL );
        RetValue = Abc_NtkDSat( pNtkSyn, (ABC_INT64_T)0, (ABC_INT64_T)0, 0, 0, 0, 1, 0, 0, 0 );
clkS = Abc_Clock() - clkS;
        if ( RetValue == 0 )
            Abc_NtkModelToVector( pNtkSyn, vPiValues );
        if ( RetValue == 1 )
        {
            break;
        }
        if ( RetValue == -1 )
        {
            printf( "Synthesis timed out.\n" );
            break;
        }
        // there is a counter-example

        // construct the verification instance
        Abc_NtkVectorClearVars( pNtk, vPiValues, nPars );
        pNtkVer = Abc_NtkMiterCofactor( pNtk, vPiValues );
        // complement the output
        Abc_ObjXorFaninC( Abc_NtkPo(pNtkVer,0), 0 );

        // solve the verification instance
clkV = Abc_Clock();
        RetValue = Abc_NtkMiterSat( pNtkVer, 0, 0, 0, NULL, NULL );
clkV = Abc_Clock() - clkV;
        if ( RetValue == 0 )
            Abc_NtkModelToVector( pNtkVer, vPiValues );
        Abc_NtkDelete( pNtkVer );
        if ( RetValue == 1 )
        {
            fFound = 1;
            break;
        }
        if ( RetValue == -1 )
        {
            printf( "Verification timed out.\n" );
            break;
        }
        // there is a counter-example

        // create a new synthesis network
        Abc_NtkVectorClearPars( vPiValues, nPars );
        pNtkSyn2 = Abc_NtkMiterCofactor( pNtk, vPiValues );
        // add to the synthesis instance
        pNtkSyn = Abc_NtkMiterAnd( pNtkTemp = pNtkSyn, pNtkSyn2, 0, 0 );
        Abc_NtkDelete( pNtkSyn2 );
        Abc_NtkDelete( pNtkTemp );

        if ( fVerbose )
        {
            printf( "Iter %2d : ", nIters+1 );
            printf( "AIG = %6d  ", Abc_NtkNodeNum(pNtkSyn) );
            Abc_NtkVectorPrintVars( pNtk, vPiValues, nPars );
            printf( "  " );
            ABC_PRT( "Syn", clkS );
//            ABC_PRT( "Ver", clkV );
        }
        if ( nIters+1 == nItersMax )
            break;
    }
    Abc_NtkDelete( pNtkSyn );
    // report the results
    if ( fFound )
    {
        int nZeros = Vec_IntCountZero( vPiValues );
        printf( "Parameters: " );
        Abc_NtkVectorPrintPars( vPiValues, nPars );
        printf( "  Statistics: 0=%d 1=%d\n", nZeros, Vec_IntSize(vPiValues) - nZeros );
        printf( "Solved after %d interations.  ", nIters );
    }
    else if ( nIters == nItersMax )
        printf( "Unsolved after %d interations.  ", nIters );
    else if ( nIters == nItersMax )
        printf( "Quit after %d interatios.  ", nItersMax );
    else
        printf( "Implementation does not exist.  " );
    ABC_PRT( "Total runtime", Abc_Clock() - clkTotal );
    Vec_IntFree( vPiValues );
}